

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_casts.cpp
# Opt level: O1

BoundCastInfo *
duckdb::DefaultCasts::GetDefaultCastFunction
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  LogicalTypeId LVar1;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_20;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_18;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_10;
  
  LVar1 = source->id_;
  if (((LVar1 != SQLNULL) && (LVar1 != UNION)) && (target->id_ == UNION)) {
    ImplicitToUnionCast(__return_storage_ptr__,input,source,target);
    return __return_storage_ptr__;
  }
  switch(LVar1) {
  case SQLNULL:
    local_10._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,NullTypeCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_10,(init_cast_local_state_t)0x0);
    if (local_10._M_head_impl != (BoundCastData *)0x0) {
      (*(local_10._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case UNKNOWN:
  case ANY:
  case USER:
  case USER|SQLNULL:
  case USER|UNKNOWN:
  case USER|ANY:
  case 8:
  case 9:
  case CHAR:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_012d5d28_caseD_2:
    local_20._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,(cast_function_t)0x0,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_20,(init_cast_local_state_t)0x0);
    if (local_20._M_head_impl != (BoundCastData *)0x0) {
      (*(local_20._M_head_impl)->_vptr_BoundCastData[1])();
    }
    break;
  case BOOLEAN:
  case TINYINT:
  case SMALLINT:
  case INTEGER:
  case BIGINT:
  case FLOAT:
  case DOUBLE:
  case UTINYINT:
  case USMALLINT:
  case UINTEGER:
  case UBIGINT:
  case UHUGEINT:
  case HUGEINT:
    NumericCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case DATE:
    DateCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case TIME:
    TimeCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case TIMESTAMP_SEC:
    TimestampSecCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case TIMESTAMP_MS:
    TimestampMsCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case TIMESTAMP:
    TimestampCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case TIMESTAMP_NS:
    TimestampNsCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case DECIMAL:
    DecimalCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case VARCHAR:
    StringCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case BLOB:
    BlobCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case INTERVAL:
    IntervalCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case TIMESTAMP_TZ:
    TimestampTzCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case TIME_TZ:
    TimeTzCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case BIT:
    BitCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case VARINT:
    VarintCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case POINTER:
    PointerCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  case UUID:
    UUIDCastSwitch(__return_storage_ptr__,input,source,target);
    break;
  default:
    switch(LVar1) {
    case STRUCT:
      StructCastSwitch(__return_storage_ptr__,input,source,target);
      break;
    case LIST:
      ListCastSwitch(__return_storage_ptr__,input,source,target);
      break;
    case MAP:
      MapCastSwitch(__return_storage_ptr__,input,source,target);
      break;
    default:
      goto switchD_012d5d28_caseD_2;
    case ENUM:
      EnumCastSwitch(__return_storage_ptr__,input,source,target);
      break;
    case AGGREGATE_STATE:
      local_18._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,AggregateStateToBlobCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_18,(init_cast_local_state_t)0x0);
      if (local_18._M_head_impl != (BoundCastData *)0x0) {
        (*(local_18._M_head_impl)->_vptr_BoundCastData[1])();
      }
      break;
    case UNION:
      UnionCastSwitch(__return_storage_ptr__,input,source,target);
      break;
    case ARRAY:
      ArrayCastSwitch(__return_storage_ptr__,input,source,target);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::GetDefaultCastFunction(BindCastInput &input, const LogicalType &source,
                                                   const LogicalType &target) {
	D_ASSERT(source != target);

	// first check if were casting to a union
	if (source.id() != LogicalTypeId::UNION && source.id() != LogicalTypeId::SQLNULL &&
	    target.id() == LogicalTypeId::UNION) {
		return ImplicitToUnionCast(input, source, target);
	}

	// else, switch on source type
	switch (source.id()) {
	case LogicalTypeId::BOOLEAN:
	case LogicalTypeId::TINYINT:
	case LogicalTypeId::SMALLINT:
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::UTINYINT:
	case LogicalTypeId::USMALLINT:
	case LogicalTypeId::UINTEGER:
	case LogicalTypeId::UBIGINT:
	case LogicalTypeId::UHUGEINT:
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::FLOAT:
	case LogicalTypeId::DOUBLE:
		return NumericCastSwitch(input, source, target);
	case LogicalTypeId::POINTER:
		return PointerCastSwitch(input, source, target);
	case LogicalTypeId::UUID:
		return UUIDCastSwitch(input, source, target);
	case LogicalTypeId::DECIMAL:
		return DecimalCastSwitch(input, source, target);
	case LogicalTypeId::DATE:
		return DateCastSwitch(input, source, target);
	case LogicalTypeId::TIME:
		return TimeCastSwitch(input, source, target);
	case LogicalTypeId::TIME_TZ:
		return TimeTzCastSwitch(input, source, target);
	case LogicalTypeId::TIMESTAMP:
		return TimestampCastSwitch(input, source, target);
	case LogicalTypeId::TIMESTAMP_TZ:
		return TimestampTzCastSwitch(input, source, target);
	case LogicalTypeId::TIMESTAMP_NS:
		return TimestampNsCastSwitch(input, source, target);
	case LogicalTypeId::TIMESTAMP_MS:
		return TimestampMsCastSwitch(input, source, target);
	case LogicalTypeId::TIMESTAMP_SEC:
		return TimestampSecCastSwitch(input, source, target);
	case LogicalTypeId::INTERVAL:
		return IntervalCastSwitch(input, source, target);
	case LogicalTypeId::VARCHAR:
		return StringCastSwitch(input, source, target);
	case LogicalTypeId::BLOB:
		return BlobCastSwitch(input, source, target);
	case LogicalTypeId::BIT:
		return BitCastSwitch(input, source, target);
	case LogicalTypeId::SQLNULL:
		return NullTypeCast;
	case LogicalTypeId::MAP:
		return MapCastSwitch(input, source, target);
	case LogicalTypeId::STRUCT:
		return StructCastSwitch(input, source, target);
	case LogicalTypeId::LIST:
		return ListCastSwitch(input, source, target);
	case LogicalTypeId::UNION:
		return UnionCastSwitch(input, source, target);
	case LogicalTypeId::ENUM:
		return EnumCastSwitch(input, source, target);
	case LogicalTypeId::ARRAY:
		return ArrayCastSwitch(input, source, target);
	case LogicalTypeId::VARINT:
		return VarintCastSwitch(input, source, target);
	case LogicalTypeId::AGGREGATE_STATE:
		return AggregateStateToBlobCast;
	default:
		return nullptr;
	}
}